

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O1

bool __thiscall Jinx::Impl::Parser::CheckValue(Parser *this)

{
  SymbolType SVar1;
  pointer pSVar2;
  
  if ((this->m_error == false) &&
     (pSVar2 = (this->m_currentSymbol)._M_current,
     pSVar2 != (this->m_symbolList->
               super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl
               .super__Vector_impl_data._M_finish)) {
    SVar1 = pSVar2->type;
    return SVar1 == Null || (SVar1 & ~NameValue) == StringValue;
  }
  return false;
}

Assistant:

inline_t bool Parser::CheckValue() const
	{
		if (m_error || m_currentSymbol == m_symbolList.end())
			return false;
		auto type = m_currentSymbol->type;
		return
			type == SymbolType::NumberValue ||
			type == SymbolType::IntegerValue ||
			type == SymbolType::BooleanValue ||
			type == SymbolType::StringValue ||
			type == SymbolType::Null;
	}